

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib536.c
# Opt level: O2

int perform(CURLM *multi)

{
  uint __i;
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  int *piVar4;
  char *pcVar5;
  undefined8 uVar6;
  timeval tVar7;
  timeval older;
  timeval older_00;
  undefined8 uStack_1d0;
  int maxfd;
  int handles;
  timeval interval;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  
  do {
    maxfd = -99;
    interval.tv_sec = 0;
    interval.tv_usec = 100000;
    iVar1 = curl_multi_perform(multi,&handles);
    uVar6 = _stderr;
    if (iVar1 != 0) {
      uVar3 = curl_multi_strerror(iVar1);
      pcVar5 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
      uStack_1d0 = 0x2d;
LAB_00102816:
      curl_mfprintf(uVar6,pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib536.c"
                    ,uStack_1d0,iVar1,uVar3);
      return iVar1;
    }
    if (handles < 0) {
      pcVar5 = 
      "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n";
      uStack_1d0 = 0x2d;
LAB_00102843:
      curl_mfprintf(_stderr,pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib536.c"
                    ,uStack_1d0);
      return 0x7a;
    }
    tVar7 = tutil_tvnow();
    older.tv_usec = tv_test_start.tv_usec;
    older.tv_sec = tv_test_start.tv_sec;
    lVar2 = tutil_tvdiff(tVar7,older);
    if (60000 < lVar2) {
      uStack_1d0 = 0x31;
      goto LAB_001027dd;
    }
    if (handles == 0) {
      return 0;
    }
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      fdread.__fds_bits[lVar2] = 0;
    }
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      fdwrite.__fds_bits[lVar2] = 0;
    }
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      fdexcep.__fds_bits[lVar2] = 0;
    }
    iVar1 = curl_multi_fdset(multi,&fdread,&fdwrite,&fdexcep,&maxfd);
    uVar6 = _stderr;
    if (iVar1 != 0) {
      uVar3 = curl_multi_strerror(iVar1);
      pcVar5 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
      uStack_1d0 = 0x3c;
      goto LAB_00102816;
    }
    if (maxfd < -1) {
      pcVar5 = "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
      uStack_1d0 = 0x3c;
      goto LAB_00102843;
    }
    iVar1 = select_wrapper(maxfd + 1,&fdread,&fdwrite,&fdexcep,&interval);
    if (iVar1 == -1) {
      piVar4 = __errno_location();
      uVar6 = _stderr;
      iVar1 = *piVar4;
      pcVar5 = strerror(iVar1);
      curl_mfprintf(uVar6,"%s:%d select() failed, with errno %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib536.c"
                    ,0x42,iVar1,pcVar5);
      return 0x79;
    }
    tVar7 = tutil_tvnow();
    older_00.tv_usec = tv_test_start.tv_usec;
    older_00.tv_sec = tv_test_start.tv_sec;
    lVar2 = tutil_tvdiff(tVar7,older_00);
  } while (lVar2 < 0xea61);
  uStack_1d0 = 0x46;
LAB_001027dd:
  curl_mfprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib536.c"
                ,uStack_1d0);
  return 0x7d;
}

Assistant:

static int perform(CURLM *multi)
{
  int handles;
  fd_set fdread, fdwrite, fdexcep;
  int res = 0;

  for(;;) {
    struct timeval interval;
    int maxfd = -99;

    interval.tv_sec = 0;
    interval.tv_usec = 100000L; /* 100 ms */

    res_multi_perform(multi, &handles);
    if(res)
      return res;

    res_test_timedout();
    if(res)
      return res;

    if(!handles)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    res_multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);
    if(res)
      return res;

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    res_select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &interval);
    if(res)
      return res;

    res_test_timedout();
    if(res)
      return res;
  }

  return 0; /* success */
}